

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t mpidr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = env->features;
  uVar2 = (uint)uVar1;
  if ((uVar2 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar3 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar3 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar3 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          bVar5 = uVar3 == 0x16;
          if (!bVar5) {
            bVar5 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar2 >> 0x1c & 1) == 0) && (uVar3 = 3, bVar5)) goto LAB_006175cd;
        }
        uVar3 = 1;
      }
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_006175cd:
  if ((uVar1 & 0x200000000) == 0) {
    bVar5 = false;
  }
  else {
    if (env->aarch64 == 0) {
      bVar5 = (env->uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      bVar5 = (~env->pstate & 0xc) == 0;
    }
    if (!bVar5) {
      bVar5 = ((env->cp15).scr_el3 & 1) == 0;
    }
  }
  if ((((uVar1 >> 0x20 & 1) != 0) && (!bVar5)) && (uVar3 == 1)) {
    return (env->cp15).vmpidr_el2;
  }
  uVar1 = *(ulong *)&env[1].spsr;
  if ((uVar2 >> 0xc & 1) != 0) {
    uVar4 = 0xc0000000;
    if (*(char *)((long)env[1].xregs + 0x2c) == '\0') {
      uVar4 = 0x80000000;
    }
    uVar1 = uVar1 | uVar4;
  }
  return uVar1;
}

Assistant:

static uint64_t mpidr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    unsigned int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);

    if (arm_feature(env, ARM_FEATURE_EL2) && !secure && cur_el == 1) {
        return env->cp15.vmpidr_el2;
    }
    return mpidr_read_val(env);
}